

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  unsigned_long_long *key;
  uint uVar1;
  int iVar2;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  uint *puVar4;
  undefined4 extraout_var_01;
  ulong uVar5;
  ulong uVar6;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  undefined8 uStackY_680;
  undefined8 uStackY_530;
  int local_4fc;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  uint tmpv [100];
  unsigned_long_long tmpk [100];
  node *pnVar3;
  undefined4 extraout_var_00;
  
  uVar6 = value->first;
  uVar1 = value->second;
  lVar12 = (long)this->depth;
  if (lVar12 == 0) {
    uStackY_530 = 0x10810a;
    iVar2 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    puVar4 = (uint *)CONCAT44(extraout_var_00,iVar2);
    this->root = extraout_RDX;
    this->depth = 1;
    puVar4[400] = 1;
    *(ulong *)(puVar4 + 0xca) = uVar6;
    *puVar4 = uVar1;
    puVar4[200] = 0xffffffff;
    puVar4[0xc9] = 0xffffffff;
    uStackY_530 = 0x10813c;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
  }
  else {
    uVar5 = lVar12 << 2;
    uVar10 = lVar12 * 8;
    if (this->depth < 0) {
      uVar5 = 0xffffffffffffffff;
      uVar10 = 0xffffffffffffffff;
    }
    uStackY_530 = 0x107fbd;
    pos = (locType *)operator_new__(uVar10);
    *pos = 0;
    uStackY_530 = 0x107fce;
    p = (node **)operator_new__(uVar10);
    uStackY_530 = 0x107fd9;
    pp = (int *)operator_new__(uVar5);
    *pos = this->root;
    lVar7 = 0;
    while( true ) {
      lVar8 = (long)(int)lVar12;
      if (lVar8 <= lVar7) break;
      uStackY_530 = 0x108018;
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + lVar7);
      pnVar3 = (node *)CONCAT44(extraout_var,iVar2);
      p[lVar7] = pnVar3;
      uVar11 = pnVar3->sz;
      if (pnVar3->sz < 1) {
        uVar11 = 0;
      }
      uVar10 = (ulong)uVar11;
      for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
        if (uVar6 <= pnVar3->keyvalue[uVar5]) {
          lVar12 = (long)this->depth;
          if (lVar12 + -1 <= lVar7) {
            uVar10 = uVar5 & 0xffffffff;
            goto LAB_00108081;
          }
          uVar10 = (ulong)(((int)uVar5 + 1) - (uint)(uVar6 < pnVar3->keyvalue[uVar5]));
          goto LAB_00108071;
        }
      }
      lVar12 = (long)this->depth;
      if (lVar7 < lVar12 + -1) {
LAB_00108071:
        (pos + lVar7)[1] = (pnVar3->field_0).pointer[(int)uVar10];
      }
LAB_00108081:
      pp[lVar7] = (int)uVar10;
      lVar7 = lVar7 + 1;
    }
    pnVar3 = p[lVar8 + -1];
    iVar2 = pnVar3->sz;
    iVar9 = (int)uVar10;
    if ((iVar9 < iVar2) && (pnVar3->keyvalue[iVar9] <= uVar6)) {
      uStackY_530 = 0x108376;
      operator_delete__(p);
      uStackY_530 = 0x108380;
      operator_delete__(pp);
      uStackY_530 = 0x10838a;
      operator_delete__(pos);
      return false;
    }
    if (iVar9 == 0) {
      for (uVar11 = (int)lVar12 - 2; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
        lVar12 = (long)pp[uVar11];
        if ((lVar12 != 0) && (p[uVar11]->keyvalue[lVar12 + -1] == pnVar3->keyvalue[0])) {
          p[uVar11]->keyvalue[lVar12 + -1] = uVar6;
          uStackY_530 = 0x1083ae;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,pos + uVar11);
          iVar2 = p[lVar8 + -1]->sz;
          break;
        }
      }
    }
    if (iVar2 < 99) {
      lVar12 = (long)iVar9;
      for (lVar7 = (long)iVar2; pnVar3 = p[lVar8 + -1], lVar12 < lVar7; lVar7 = lVar7 + -1) {
        pnVar3->keyvalue[lVar7] = pnVar3->keyvalue[lVar7 + -1];
        (pnVar3->field_0).val[lVar7] = *(uint *)((long)pnVar3 + lVar7 * 4 + -4);
      }
      pnVar3->keyvalue[lVar12] = uVar6;
      (pnVar3->field_0).val[lVar12] = uVar1;
      p[lVar8 + -1]->sz = p[lVar8 + -1]->sz + 1;
      uStackY_530 = 0x1081d1;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    }
    else {
      lVar12 = (long)iVar9;
      uStackY_530 = 0x108152;
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[1])();
      lnk.first = (node *)CONCAT44(extraout_var_01,iVar2);
      uVar5 = 0;
      if (0 < iVar9) {
        uVar5 = uVar10 & 0xffffffff;
      }
      for (lVar7 = 0x65; lVar7 - uVar5 != 0x65; lVar7 = lVar7 + 1) {
        pnVar3 = p[lVar8 + -1];
        *(undefined4 *)((long)&uStackY_680 + lVar7 * 4 + 4) =
             *(undefined4 *)((long)pnVar3 + lVar7 * 4 + -0x194);
        (&uStackY_680)[lVar7] = (pnVar3->field_0).pointer[lVar7];
      }
      tmpv[lVar12] = uVar1;
      for (; tmpk[lVar12] = uVar6, lVar12 < 99; lVar12 = lVar12 + 1) {
        pnVar3 = p[lVar8 + -1];
        tmpv[lVar12 + 1] = (pnVar3->field_0).val[lVar12];
        uVar6 = pnVar3->keyvalue[lVar12];
      }
      pnVar3 = p[lVar8 + -1];
      (lnk.first)->nxt = pnVar3->nxt;
      pnVar3->sz = 0x32;
      uVar6 = 0x32;
      for (lVar12 = 0; lVar7 = (long)(int)uVar6, lVar12 < lVar7; lVar12 = lVar12 + 1) {
        (pnVar3->field_0).val[lVar12] = tmpv[lVar12];
        pnVar3 = p[lVar8 + -1];
        pnVar3->keyvalue[lVar12] = tmpk[lVar12];
        uVar6 = (ulong)(uint)pnVar3->sz;
      }
      pnVar3->nxt = extraout_RDX_00;
      key = (lnk.first)->keyvalue;
      for (; lVar7 < 100; lVar7 = lVar7 + 1) {
        *(uint *)((long)lnk.first + lVar7 * 4 + (long)(int)uVar6 * -4) = tmpv[lVar7];
        uVar6 = (ulong)p[lVar8 + -1]->sz;
        *(unsigned_long_long *)((long)lnk.first + lVar7 * 8 + uVar6 * -8 + 0x328) = tmpk[lVar7];
      }
      (lnk.first)->sz = 100 - (int)uVar6;
      uStackY_530 = 0x1082cc;
      lnk.second = extraout_RDX_00;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])();
      uStackY_530 = 0x1082e1;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
      local_4fc = this->depth + -2;
      uStackY_530 = 0x10830b;
      insertnonleaf(this,key,&local_4fc,p,pp,pos,lnk.second);
    }
    uStackY_530 = 0x108313;
    operator_delete__(p);
    uStackY_530 = 0x10831b;
    operator_delete__(pp);
    uStackY_530 = 0x108323;
    operator_delete__(pos);
    this->siz = this->siz + 1;
  }
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }